

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O3

void anon_unknown.dwarf_b35c3::AssertInt8Equals
               (uint8_t expected,char *s,ParseIntTypeCombo parse_type)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  int line;
  char *pcVar4;
  uchar actual;
  AssertionResult gtest_ar;
  uint8_t local_4a;
  uint8_t local_49;
  Message local_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertHelper local_30;
  
  local_49 = expected;
  sVar3 = strlen(s);
  pcVar4 = s + sVar3;
  if (parse_type == Both) {
    local_48.ss_.ptr_._0_4_ = 0;
    local_30.data_._0_4_ = wabt::ParseInt8(s,pcVar4,&local_4a,UnsignedOnly);
    testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
              (local_40,"Result::Ok","parse_int(s, end, &actual, ParseIntType::UnsignedOnly)",
               (Enum *)&local_48,(Result *)&local_30);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message(&local_48);
      lVar1 = CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_);
      if (s == (char *)0x0) {
        s = "(null)";
        sVar3 = 6;
      }
      else {
        sVar3 = strlen(s);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar1 + 0x10),s,sVar3);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x2d;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                (local_40,"expected","actual",&local_49,&local_4a);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message(&local_48);
        if (local_38.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((local_38.ptr_)->_M_dataplus)._M_p;
        }
        line = 0x2f;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
LAB_001e598c:
        local_48.ss_.ptr_._0_4_ = 0;
        local_30.data_._0_4_ = wabt::ParseInt8(s,pcVar4,&local_4a,SignedAndUnsigned);
        testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
                  (local_40,"Result::Ok",
                   "parse_int(s, end, &actual, ParseIntType::SignedAndUnsigned)",(Enum *)&local_48,
                   (Result *)&local_30);
        if (local_40[0] == (internal)0x0) {
          testing::Message::Message(&local_48);
          lVar1 = CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_);
          if (s == (char *)0x0) {
            s = "(null)";
            sVar3 = 6;
          }
          else {
            sVar3 = strlen(s);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar1 + 0x10),s,sVar3);
          if (local_38.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_38.ptr_)->_M_dataplus)._M_p;
          }
          line = 0x38;
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                    (local_40,"expected","actual",&local_49,&local_4a);
          if (local_40[0] != (internal)0x0) goto LAB_001e5d3f;
          testing::Message::Message(&local_48);
          if (local_38.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((local_38.ptr_)->_M_dataplus)._M_p;
          }
          line = 0x3a;
        }
      }
    }
  }
  else {
    local_48.ss_.ptr_._0_4_ = 1;
    local_30.data_._0_4_ = wabt::ParseInt8(s,pcVar4,&local_4a,UnsignedOnly);
    testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
              (local_40,"Result::Error","parse_int(s, end, &actual, ParseIntType::UnsignedOnly)",
               (Enum *)&local_48,(Result *)&local_30);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message(&local_48);
      lVar1 = CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_);
      if (s == (char *)0x0) {
        s = "(null)";
        sVar3 = 6;
      }
      else {
        sVar3 = strlen(s);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar1 + 0x10),s,sVar3);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x32;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (parse_type - SignedAndUnsigned < 2) goto LAB_001e598c;
      local_48.ss_.ptr_._0_4_ = 1;
      local_30.data_._0_4_ = wabt::ParseInt8(s,pcVar4,&local_4a,SignedAndUnsigned);
      testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
                (local_40,"Result::Error",
                 "parse_int(s, end, &actual, ParseIntType::SignedAndUnsigned)",(Enum *)&local_48,
                 (Result *)&local_30);
      if (local_40[0] != (internal)0x0) goto LAB_001e5d3f;
      testing::Message::Message(&local_48);
      lVar1 = CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_);
      if (s == (char *)0x0) {
        s = "(null)";
        sVar3 = 6;
      }
      else {
        sVar3 = strlen(s);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar1 + 0x10),s,sVar3);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x3d;
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_30,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-literal.cc"
             ,line,pcVar4);
  testing::internal::AssertHelper::operator=(&local_30,&local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  if (((CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) != 0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((long *)CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) != (long *)0x0)) {
    (**(code **)(*(long *)CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) + 8))();
  }
LAB_001e5d3f:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

void AssertInt8Equals(uint8_t expected,
                      const char* s,
                      ParseIntTypeCombo parse_type = Both) {
  AssertIntEquals(expected, s, ParseInt8, parse_type);
}